

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::push_back
          (SubroutineFunctionSet *this,SubroutineFunction *_fn)

{
  pointer *ppSVar1;
  SubroutineFunction *__last;
  pointer __first;
  ulong uVar2;
  pointer __result;
  pointer pSVar3;
  ulong uVar4;
  _Tp_alloc_type *__alloc;
  long lVar5;
  _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  *this_00;
  
  __last = (this->fn).
           super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__last == (this->fn).
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->fn).
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)__last - (long)__first;
    if (lVar5 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar2 = lVar5 / 0x108;
    uVar4 = 1;
    if (__last != __first) {
      uVar4 = uVar2;
    }
    this_00 = (_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               *)(uVar4 + uVar2);
    if ((_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
         *)0x7c1f07c1f07c1e < this_00) {
      this_00 = (_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                 *)0x7c1f07c1f07c1f;
    }
    __alloc = (_Tp_alloc_type *)(uVar4 + uVar2);
    if (CARRY8(uVar4,uVar2)) {
      this_00 = (_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                 *)0x7c1f07c1f07c1f;
    }
    __result = std::
               _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               ::_M_allocate(this_00,0x108);
    SubroutineFunction::SubroutineFunction((SubroutineFunction *)(lVar5 + (long)__result),_fn);
    pSVar3 = std::
             vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             ::_S_relocate(__first,__last,__result,__alloc);
    pSVar3 = std::
             vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             ::_S_relocate(__last,__last,pSVar3 + 1,(_Tp_alloc_type *)0x108);
    lVar5 = (long)(this->fn).
                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    std::
    _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ::_M_deallocate((_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                     *)__first,(pointer)(lVar5 / 0x108),lVar5 % 0x108);
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    SubroutineFunction::SubroutineFunction(__last,_fn);
    ppSVar1 = &(this->fn).
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  return;
}

Assistant:

void push_back(const SubroutineFunction& _fn)
	{
		fn.push_back(_fn);
	}